

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O1

QRectF * __thiscall
QGraphicsWidget::windowFrameGeometry(QRectF *__return_storage_ptr__,QGraphicsWidget *this)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  long in_FS_OFFSET;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 0x18);
  if (*(long *)(lVar2 + 0x1e8) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QGraphicsLayoutItem::geometry((QGraphicsLayoutItem *)(this + 0x20));
      return __return_storage_ptr__;
    }
  }
  else {
    QGraphicsLayoutItem::geometry((QGraphicsLayoutItem *)(this + 0x20));
    pdVar3 = *(double **)(lVar2 + 0x1e8);
    dVar4 = *pdVar3;
    dVar5 = pdVar3[1];
    dVar6 = pdVar3[2];
    dVar7 = pdVar3[3];
    __return_storage_ptr__->xp = local_48 - dVar4;
    __return_storage_ptr__->yp = dStack_40 - dVar5;
    __return_storage_ptr__->w = dVar6 + local_38 + dVar4;
    __return_storage_ptr__->h = dVar7 + dStack_30 + dVar5;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsWidget::windowFrameGeometry() const
{
    Q_D(const QGraphicsWidget);
    return d->windowFrameMargins
        ? geometry().adjusted(-d->windowFrameMargins->left(), -d->windowFrameMargins->top(),
                              d->windowFrameMargins->right(), d->windowFrameMargins->bottom())
        : geometry();
}